

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O0

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::on_accept(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
            *this,error_code *e)

{
  bool bVar1;
  shared_ptr<cppcms::http::context> *this_00;
  error_code *in_RSI;
  undefined8 *in_RDI;
  context *unaff_retaddr;
  shared_ptr<cppcms::impl::cgi::connection> *in_stack_00000018;
  context *in_stack_00000020;
  shared_ptr<cppcms::http::context> cnt;
  context *in_stack_ffffffffffffff98;
  __shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> local_30 [3];
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    if ((*(byte *)((long)in_RDI + 0x59) & 1) != 0) {
      booster::aio::basic_socket::set_option(in_RDI[4],0,1);
    }
    if (*(int *)((long)in_RDI + 0x5c) != -1) {
      booster::aio::basic_socket::set_option(in_RDI[4],1,*(undefined4 *)((long)in_RDI + 0x5c));
    }
    if (*(int *)(in_RDI + 0xc) != -1) {
      booster::aio::basic_socket::set_option(in_RDI[4],0,*(undefined4 *)(in_RDI + 0xc));
    }
    this_00 = (shared_ptr<cppcms::http::context> *)operator_new(0x28);
    this_01 = local_30;
    std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection> *)this_00,
               (shared_ptr<cppcms::impl::cgi::connection> *)in_stack_ffffffffffffff98);
    cppcms::http::context::context(in_stack_00000020,in_stack_00000018);
    std::shared_ptr<cppcms::http::context>::shared_ptr<cppcms::http::context,void>
              (this_00,in_stack_ffffffffffffff98);
    std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection> *)0x4965bb);
    std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::reset(this_01);
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4965d3);
    cppcms::http::context::run(unaff_retaddr);
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x4965e7);
  }
  (**(code **)*in_RDI)();
  return;
}

Assistant:

void on_accept(booster::system::error_code const &e)
			{
				if(!e) {
					
					if(tcp_)
						asio_socket_->set_option(io::basic_socket::tcp_no_delay,true);
					if(sndbuf_!=-1)
						asio_socket_->set_option(io::basic_socket::send_buffer_size,sndbuf_);
					if(rcvbuf_!=-1)
						asio_socket_->set_option(io::basic_socket::receive_buffer_size,rcvbuf_);
					booster::shared_ptr< ::cppcms::http::context> cnt(new ::cppcms::http::context(api_));
					api_.reset();
					cnt->run();	
				}
				async_accept();
			}